

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O2

boolean cursed_book(obj *bp)

{
  int iVar1;
  char *pcVar2;
  ushort uVar3;
  uint uVar4;
  boolean bVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  
  iVar1 = rn2((int)objects[bp->otyp].oc_oc2);
  uVar6 = u.uprops[0x1e].intrinsic;
  switch(iVar1) {
  case 0:
    bVar5 = '\0';
    pline("You feel a wrenching sensation.");
    tele((char *)0x0);
    break;
  case 1:
    bVar5 = '\0';
    pline("You feel threatened.");
    aggravate();
    break;
  case 2:
    uVar4 = mt_random();
    bVar5 = '\0';
    make_blinded((ulong)(uVar6 + uVar4 % 100 + 0xfa),'\x01');
    break;
  case 3:
    take_gold();
    goto LAB_00237c64;
  case 4:
    bVar5 = '\0';
    pline("These runes were just too much to comprehend.");
    uVar6 = u.uprops[0x1c].intrinsic;
    uVar4 = mt_random();
    make_confused((ulong)(uVar6 + uVar4 % 7 + 0x10),'\0');
    break;
  case 5:
    pline("The book was coated with contact poison!");
    if (uarmg == (obj *)0x0) {
      bp->field_0x4c = bp->field_0x4c & 0x7f;
      bVar8 = (youmonst.mintrinsics & 0x20) == 0;
      uVar6 = 1;
      if (u.uprops[6].extrinsic == 0 && u.uprops[6].intrinsic == 0) {
        uVar6 = bVar8 + 1 + (uint)bVar8;
      }
      uVar4 = mt_random();
      losestr(uVar6 + (uVar4 & uVar6),'\0');
      if (u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) {
        iVar1 = (uint)((youmonst.mintrinsics & 0x20) == 0) * 4 + 6;
      }
      else {
        iVar1 = 6;
        if (((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
           ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)) {
          iVar1 = (uint)((youmonst.mintrinsics & 0x20) == 0) * 2 + 6;
        }
      }
      iVar1 = rnd(iVar1);
      losehp(iVar1,"contact-poisoned spellbook",0);
      bp->field_0x4c = bp->field_0x4c | 0x80;
      return '\0';
    }
    uVar6 = *(uint *)&uarmg->field_0x4a;
    if (((uVar6 >> 0xc & 1) != 0) ||
       ((uVar3 = *(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f, uVar3 != 0xb &&
        (uVar3 != 0xd)))) {
      pline("Your gloves seem unaffected.");
      return '\0';
    }
    uVar4 = uVar6 >> 10 & 3;
    if (uVar4 == 3) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          if (((youmonst.data)->mflags1 & 0x1000) == 0) {
            pcVar2 = "look";
            goto LAB_00237ee8;
          }
          goto LAB_00237d07;
        }
      }
      else {
LAB_00237d07:
        if (ublindf == (obj *)0x0) {
          pcVar2 = "feel";
          goto LAB_00237ee8;
        }
      }
      pcVar2 = "feel";
      if (ublindf->oartifact == '\x1d') {
        pcVar2 = "look";
      }
LAB_00237ee8:
      pline("Your gloves %s completely corroded.",pcVar2);
      return '\0';
    }
    if ((uVar6 >> 0x14 & 1) == 0) {
      pcVar2 = " further";
      if (uVar4 == 0) {
        pcVar2 = "";
      }
      pcVar7 = " completely";
      if (uVar4 != 2) {
        pcVar7 = pcVar2;
      }
      pline("Your gloves corrode%s!",pcVar7);
      *(uint *)&uarmg->field_0x4a =
           *(uint *)&uarmg->field_0x4a & 0xfffff3ff | *(uint *)&uarmg->field_0x4a + 0x400 & 0xc00;
      return '\0';
    }
    grease_protect(uarmg,"gloves",&youmonst);
    goto LAB_00237c64;
  case 6:
    pcVar2 = body_part(2);
    pline("As you read the book, it %s in your %s!","radiates explosive energy",pcVar2);
    iVar1 = rnd(10);
    mana_damageu(iVar1 * 2 + 5,(monst *)0x0,"exploding rune",0,'\0');
    bVar5 = '\x01';
    break;
  default:
    rndcurse();
LAB_00237c64:
    bVar5 = '\0';
  }
  return bVar5;
}

Assistant:

static boolean cursed_book(struct obj *bp)
{
	int lev = objects[bp->otyp].oc_level;

	switch(rn2(lev)) {
	case 0:
		pline("You feel a wrenching sensation.");
		tele(NULL);		/* teleport him */
		break;
	case 1:
		pline("You feel threatened.");
		aggravate();
		break;
	case 2:
		make_blinded(Blinded + rn1(100,250),TRUE);
		break;
	case 3:
		take_gold();
		break;
	case 4:
		pline("These runes were just too much to comprehend.");
		make_confused(HConfusion + rn1(7,16),FALSE);
		break;
	case 5:
		pline("The book was coated with contact poison!");
		if (uarmg) {
		    if (uarmg->oerodeproof || !is_corrodeable(uarmg)) {
			pline("Your gloves seem unaffected.");
		    } else if (uarmg->oeroded2 < MAX_ERODE) {
			if (uarmg->greased) {
			    grease_protect(uarmg, "gloves", &youmonst);
			} else {
			    pline("Your gloves corrode%s!",
				 uarmg->oeroded2+1 == MAX_ERODE ?
				 " completely" : uarmg->oeroded2 ?
				 " further" : "");
			    uarmg->oeroded2++;
			}
		    } else
			pline("Your gloves %s completely corroded.",
			     Blind ? "feel" : "look");
		    break;
		}
		/* temp disable in_use; death should not destroy the book */
		bp->in_use = FALSE;
		losestr(Poison_resistance ? rn1(2,1) : rn1(4,3), FALSE);
		losehp(rnd(FPoison_resistance ? 6 :
			   PPoison_resistance ? 8 : 10),
		       "contact-poisoned spellbook", KILLED_BY_AN);
		bp->in_use = TRUE;
		break;
	case 6:
		pline("As you read the book, it %s in your %s!",
		      explodes, body_part(FACE));
		mana_damageu(2 * rnd(10) + 5, NULL,
			     "exploding rune", KILLED_BY_AN, FALSE);
		return TRUE;
	default:
		rndcurse();
		break;
	}
	return FALSE;
}